

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_movcf_d(DisasContext_conflict6 *ctx,int fs,int fd,int cc,int tf)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i32 ret;
  TCGLabel *l;
  TCGv_i64 t;
  int32_t arg2;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  l = gen_new_label_mips64el(tcg_ctx);
  arg2 = 0x800000;
  if (cc != 0) {
    arg2 = 0x1000000 << ((byte)cc & 0x1f);
  }
  tcg_gen_andi_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,arg2);
  tcg_gen_brcondi_i32_mips64el(tcg_ctx,(tf == 0) + TCG_COND_EQ,ret,0,l);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_fpr64(ctx,t,fs);
  gen_store_fpr64(ctx,t,fd);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  gen_set_label(tcg_ctx,l);
  return;
}

Assistant:

static inline void gen_movcf_d(DisasContext *ctx, int fs, int fd, int cc,
                               int tf)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int cond;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i64 fp0;
    TCGLabel *l1 = gen_new_label(tcg_ctx);

    if (tf) {
        cond = TCG_COND_EQ;
    } else {
        cond = TCG_COND_NE;
    }

    tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, 1 << get_fp_bit(cc));
    tcg_gen_brcondi_i32(tcg_ctx, cond, t0, 0, l1);
    tcg_temp_free_i32(tcg_ctx, t0);
    fp0 = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx, fp0, fs);
    gen_store_fpr64(ctx, fp0, fd);
    tcg_temp_free_i64(tcg_ctx, fp0);
    gen_set_label(tcg_ctx, l1);
}